

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::timer_wheel_engine
          (timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this,uint wheel_size,duration granularity,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *error_logger,function<void_(const_std::exception_&)> *exception_handler)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90 [4];
  function<void_(const_std::exception_&)> local_70;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  function<void_(const_std::exception_&)> *local_30;
  function<void_(const_std::exception_&)> *exception_handler_local;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *error_logger_local;
  timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *ptStack_18;
  uint wheel_size_local;
  timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  duration granularity_local;
  
  local_30 = exception_handler;
  exception_handler_local = (function<void_(const_std::exception_&)> *)error_logger;
  error_logger_local._4_4_ = wheel_size;
  ptStack_18 = this;
  this_local = (timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                *)granularity.__r;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_50,error_logger);
  std::function<void_(const_std::exception_&)>::function(&local_70,exception_handler);
  engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::engine_common(&this->
                   super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                  ,&local_50,&local_70);
  std::function<void_(const_std::exception_&)>::~function(&local_70);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_50);
  this->m_wheel_size = error_logger_local._4_4_;
  (this->m_granularity).__r = (rep)this_local;
  this->m_current_position = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_current_tick_border);
  this->m_current_tick_processed = false;
  std::
  vector<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
  ::vector(&this->m_wheel);
  std::
  vector<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
  ::resize(&this->m_wheel,(ulong)error_logger_local._4_4_);
  local_90[0].__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  tVar1 = std::chrono::operator+(local_90,&this->m_granularity);
  (this->m_current_tick_border).__d.__r = (rep)tVar1.__d.__r;
  return;
}

Assistant:

timer_wheel_engine(
		//! Size of the wheel.
		unsigned int wheel_size,
		//! Size of time step for the timer_wheel.
		monotonic_clock::duration granularity,
		//! An error logger for timer thread.
		ERROR_LOGGER error_logger,
		//! An actor exception handler for timer thread.
		ACTOR_EXCEPTION_HANDLER exception_handler )
		:	base_type( error_logger, exception_handler )
		,	m_wheel_size( wheel_size )
		,	m_granularity( granularity )
	{
		m_wheel.resize( wheel_size );

		m_current_tick_border = monotonic_clock::now() + m_granularity;
	}